

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O3

XCKernel __thiscall ExchCXX::libxc_kernel_factory(ExchCXX *this,Kernel kern,Spin spin_polar)

{
  iterator iVar1;
  tuple<ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  this_00;
  exchcxx_exception *this_01;
  __uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  local_70;
  string local_68;
  string local_48;
  
  local_70._M_t.
  super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
  .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl._0_4_ = kern;
  iVar1 = std::
          _Hashtable<ExchCXX::Kernel,_std::pair<const_ExchCXX::Kernel,_int>,_std::allocator<std::pair<const_ExchCXX::Kernel,_int>_>,_std::__detail::_Select1st,_std::equal_to<ExchCXX::Kernel>,_std::hash<ExchCXX::Kernel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<ExchCXX::Kernel,_std::pair<const_ExchCXX::Kernel,_int>,_std::allocator<std::pair<const_ExchCXX::Kernel,_int>_>,_std::__detail::_Select1st,_std::equal_to<ExchCXX::Kernel>,_std::hash<ExchCXX::Kernel>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)libxc_kernel_map,(key_type *)&local_70);
  if (iVar1.super__Node_iterator_base<std::pair<const_ExchCXX::Kernel,_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    this_00.
    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          )operator_new(0x1b8);
    detail::LibxcKernelImpl::LibxcKernelImpl
              ((LibxcKernelImpl *)
               this_00.
               super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
               .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl,kern,
               spin_polar);
    local_70._M_t.
    super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
    .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
         (tuple<ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          )(tuple<ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
            )this_00.
             super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
             .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl;
    XCKernel::XCKernel((XCKernel *)this,(impl_ptr *)&local_70);
    if ((_Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
         )local_70._M_t.
          super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl !=
        (XCKernelImpl *)0x0) {
      (**(code **)(*(long *)local_70._M_t.
                            super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
                            .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>.
                            _M_head_impl + 8))();
    }
    return (impl_ptr)(impl_ptr)this;
  }
  this_01 = (exchcxx_exception *)__cxa_allocate_exception(0x50);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/src/libxc.cxx"
             ,"");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"KERNEL NYI FOR Libxc BACKEND","");
  exchcxx_exception::exchcxx_exception(this_01,&local_68,0x7b,&local_48);
  __cxa_throw(this_01,&exchcxx_exception::typeinfo,exchcxx_exception::~exchcxx_exception);
}

Assistant:

XCKernel libxc_kernel_factory(const Kernel kern, 
  const Spin spin_polar ) {

  EXCHCXX_BOOL_CHECK( "KERNEL NYI FOR Libxc BACKEND", libxc_supports_kernel(kern) )

  return XCKernel( 
    std::make_unique< detail::LibxcKernelImpl >( kern, spin_polar ) );

}